

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O3

void bitrv2(size_t n,size_t *ip,float *a)

{
  undefined8 uVar1;
  size_t *psVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  float *pfVar7;
  long lVar8;
  size_t sVar9;
  
  *ip = 0;
  if (n < 9) {
    if (n != 8) {
      return;
    }
    pfVar7 = a + 2;
    lVar3 = 2;
    lVar6 = 1;
  }
  else {
    lVar6 = 1;
    do {
      lVar4 = lVar6;
      n = n >> 1;
      psVar2 = ip;
      for (lVar6 = lVar4; lVar6 != 0; lVar6 = lVar6 + -1) {
        psVar2[lVar4] = *psVar2 + n;
        psVar2 = psVar2 + 1;
      }
      lVar6 = lVar4 * 2;
    } while ((ulong)(lVar4 * 0x10) < n);
    lVar3 = lVar4 << 2;
    if (lVar4 * 0x10 != n) {
      if (lVar6 == 0) {
        return;
      }
      lVar3 = 1;
      do {
        sVar9 = ip[lVar3];
        lVar8 = 0;
        do {
          lVar5 = ip[lVar8] + lVar3 * 2;
          uVar1 = *(undefined8 *)(a + sVar9 + lVar8 * 2);
          *(undefined8 *)(a + sVar9 + lVar8 * 2) = *(undefined8 *)(a + lVar5);
          *(undefined8 *)(a + lVar5) = uVar1;
          uVar1 = *(undefined8 *)(a + lVar4 * 4 + sVar9 + lVar8 * 2);
          *(undefined8 *)(a + lVar4 * 4 + sVar9 + lVar8 * 2) =
               *(undefined8 *)(a + lVar4 * 4 + lVar5);
          *(undefined8 *)(a + lVar4 * 4 + lVar5) = uVar1;
          lVar8 = lVar8 + 1;
        } while (lVar3 != lVar8);
        lVar3 = lVar3 + 1;
      } while (lVar3 != lVar6);
      return;
    }
    if (lVar6 == 0) {
      return;
    }
    pfVar7 = a + lVar4 * 4;
  }
  lVar4 = 0;
  do {
    if (lVar4 == 0) {
      sVar9 = *ip;
    }
    else {
      sVar9 = ip[lVar4];
      lVar8 = 0;
      do {
        lVar5 = ip[lVar8] + lVar4 * 2;
        uVar1 = *(undefined8 *)(a + sVar9 + lVar8 * 2);
        *(undefined8 *)(a + sVar9 + lVar8 * 2) = *(undefined8 *)(a + lVar5);
        *(undefined8 *)(a + lVar5) = uVar1;
        lVar5 = lVar5 + lVar6 * 4;
        uVar1 = *(undefined8 *)(a + lVar3 + sVar9 + lVar8 * 2);
        *(undefined8 *)(a + lVar3 + sVar9 + lVar8 * 2) = *(undefined8 *)(a + lVar5);
        *(undefined8 *)(a + lVar5) = uVar1;
        lVar5 = lVar5 - lVar3;
        uVar1 = *(undefined8 *)(a + lVar3 * 2 + sVar9 + lVar8 * 2);
        *(undefined8 *)(a + lVar3 * 2 + sVar9 + lVar8 * 2) = *(undefined8 *)(a + lVar5);
        *(undefined8 *)(a + lVar5) = uVar1;
        uVar1 = *(undefined8 *)(pfVar7 + lVar3 * 2 + sVar9 + lVar8 * 2);
        *(undefined8 *)(pfVar7 + lVar3 * 2 + sVar9 + lVar8 * 2) =
             *(undefined8 *)(a + lVar6 * 4 + lVar5);
        *(undefined8 *)(a + lVar6 * 4 + lVar5) = uVar1;
        lVar8 = lVar8 + 1;
      } while (lVar4 != lVar8);
    }
    lVar8 = sVar9 + (lVar4 + lVar6) * 2;
    uVar1 = *(undefined8 *)(a + lVar8);
    *(undefined8 *)(a + lVar8) = *(undefined8 *)(pfVar7 + lVar8);
    *(undefined8 *)(pfVar7 + lVar8) = uVar1;
    lVar4 = lVar4 + 1;
  } while (lVar4 != lVar6);
  return;
}

Assistant:

static void bitrv2(size_t n, size_t *ip, float *a)
{
    size_t j, j1, k, k1, l, m, m2;
    float xr, xi, yr, yi;

    ip[0] = 0;
    l = n;
    m = 1;
    while ((m << 3) < l) {
        l >>= 1;
        for (j = 0; j < m; j++) {
            ip[m + j] = ip[j] + l;
        }
        m <<= 1;
    }
    m2 = 2 * m;
    if ((m << 3) == l) {
        for (k = 0; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 -= m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
            j1 = 2 * k + m2 + ip[k];
            k1 = j1 + m2;
            xr = a[j1];
            xi = a[j1 + 1];
            yr = a[k1];
            yi = a[k1 + 1];
            a[j1] = yr;
            a[j1 + 1] = yi;
            a[k1] = xr;
            a[k1 + 1] = xi;
        }
    } else {
        for (k = 1; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
        }
    }
}